

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryReader::read<pbrt::math::vec4i,std::allocator<pbrt::math::vec4i>,void>
          (BinaryReader *this,vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *vt)

{
  BinaryReader *in_RDI;
  vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *unaff_retaddr;
  vec4i *in_stack_00000008;
  uint64_t length;
  unsigned_long *in_stack_ffffffffffffffd8;
  
  read<unsigned_long,void>(in_RDI,in_stack_ffffffffffffffd8);
  std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::resize
            (unaff_retaddr,(size_type)in_RDI);
  std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::data
            ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)0x11336b);
  copyBytes<pbrt::math::vec4i>((BinaryReader *)length,in_stack_00000008,(size_t)unaff_retaddr);
  return;
}

Assistant:

inline void read(std::vector<T, A> &vt)
    {
      uint64_t length;
      read(length);
      vt.resize(length);
      copyBytes(vt.data(), length*sizeof(T));
    }